

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O3

ze_result_t zesDeviceGetEccState(zes_device_handle_t hDevice,zes_device_ecc_properties_t *pState)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x20) + 0xe0);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zesDeviceGetEccState(
    zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
    zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnDeviceGetEccState_t pfnGetEccState = [&result] {
        auto pfnGetEccState = ze_lib::context->zesDdiTable.load()->Device.pfnGetEccState;
        if( nullptr == pfnGetEccState ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetEccState;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetEccState( hDevice, pState );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetEccState = ze_lib::context->zesDdiTable.load()->Device.pfnGetEccState;
    if( nullptr == pfnGetEccState ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetEccState( hDevice, pState );
    #endif
}